

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum.hpp
# Opt level: O0

bool magic_enum::detail::cmp_equal<magic_enum::detail::case_insensitive<std::equal_to<void>>&>
               (string_view lhs,string_view rhs,case_insensitive<std::equal_to<void>_> *p)

{
  char lhs_00;
  enable_if_t<std::is_same_v<std::decay_t<char>,_char_type>_&&_std::is_same_v<std::decay_t<char>,_char_type>,_bool>
  eVar1;
  size_type sVar2;
  size_type sVar3;
  const_reference pvVar4;
  size_type local_50;
  size_t i;
  size_type size;
  bool workaround;
  case_insensitive<std::equal_to<void>_> *p_local;
  string_view rhs_local;
  string_view lhs_local;
  
  rhs_local._M_len = (size_t)rhs._M_str;
  p_local = (case_insensitive<std::equal_to<void>_> *)rhs._M_len;
  rhs_local._M_str = (char *)lhs._M_len;
  sVar2 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
  sVar3 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&p_local);
  if (sVar2 == sVar3) {
    sVar2 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
    for (local_50 = 0; local_50 < sVar2; local_50 = local_50 + 1) {
      pvVar4 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str,
                          local_50);
      lhs_00 = *pvVar4;
      pvVar4 = Catch::clara::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&p_local,local_50);
      eVar1 = case_insensitive<std::equal_to<void>>::operator()(p,lhs_00,*pvVar4);
      if (!eVar1) {
        return false;
      }
    }
    lhs_local._M_str._7_1_ = true;
  }
  else {
    lhs_local._M_str._7_1_ = false;
  }
  return lhs_local._M_str._7_1_;
}

Assistant:

constexpr bool cmp_equal(string_view lhs, string_view rhs, [[maybe_unused]] BinaryPredicate&& p) noexcept(is_nothrow_invocable<BinaryPredicate>()) {
#if defined(_MSC_VER) && _MSC_VER < 1920 && !defined(__clang__)
  // https://developercommunity.visualstudio.com/content/problem/360432/vs20178-regression-c-failed-in-test.html
  // https://developercommunity.visualstudio.com/content/problem/232218/c-constexpr-string-view.html
  constexpr bool workaround = true;
#else
  constexpr bool workaround = false;
#endif

  if constexpr (!is_default_predicate<BinaryPredicate>() || workaround) {
    if (lhs.size() != rhs.size()) {
      return false;
    }

    const auto size = lhs.size();
    for (std::size_t i = 0; i < size; ++i) {
      if (!p(lhs[i], rhs[i])) {
        return false;
      }
    }

    return true;
  } else {
    return lhs == rhs;
  }
}